

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  type_conflict5 tVar1;
  char *pcVar2;
  DataKey DVar3;
  int *piVar4;
  undefined4 in_EDX;
  int extraout_EDX;
  int __c;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  undefined4 in_register_00000014;
  undefined8 in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int idx;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined1 local_180 [4];
  int in_stack_fffffffffffffe84;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe88;
  uint local_100;
  undefined1 local_fc [128];
  int local_7c;
  DataKey *local_78;
  undefined8 local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  uint *local_28;
  undefined1 *local_20;
  uint *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_78 = (DataKey *)CONCAT44(in_register_00000014,in_EDX);
  local_58 = local_fc;
  local_70 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
  local_100 = IdxSet::size((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0x13a0));
  __c = extraout_EDX;
  while (local_100 = local_100 - 1, -1 < (int)local_100) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0x13a0),
                           (char *)(ulong)local_100,__c);
    local_7c = (int)pcVar2;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::test(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)((in_RDI->data)._M_elems + 4));
    local_40 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_RDI,in_stack_fffffffffffffe6c);
    local_38 = local_fc;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_28 = (in_RDI->data)._M_elems + 6;
    local_20 = local_180;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_28);
    local_10 = local_180;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_8 = local_180;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RDI);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x778586);
    if (tVar1) {
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x7785a1);
      __c = extraout_EDX_00;
      if (tVar1) {
        DVar3 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
        *local_78 = DVar3;
        local_48 = local_70;
        local_50 = local_fc;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        __c = extraout_EDX_01;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(*(long *)((in_RDI->data)._M_elems + 4) + 0x13a0),
                     (char *)(ulong)local_100);
      piVar4 = DataArray<int>::operator[]
                         ((DataArray<int> *)(*(long *)((in_RDI->data)._M_elems + 4) + 0x1418),
                          local_7c);
      *piVar4 = 0;
      __c = extraout_EDX_02;
    }
  }
  return (SPxId)*local_78;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseCoDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = this->thesolver->test()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->id(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         assert(this->thesolver->isInfeasibleCo[idx] > 0);
         this->thesolver->isInfeasibleCo[idx] = 0;
      }
   }

   return enterId;
}